

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::ConcurrentAssertionStatementSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((((kind == AssertPropertyStatement) || (kind == AssumePropertyStatement)) ||
      (kind - CoverPropertyStatement < 2)) ||
     ((kind == ExpectPropertyStatement || (kind == RestrictPropertyStatement)))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ConcurrentAssertionStatementSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AssertPropertyStatement:
        case SyntaxKind::AssumePropertyStatement:
        case SyntaxKind::CoverPropertyStatement:
        case SyntaxKind::CoverSequenceStatement:
        case SyntaxKind::ExpectPropertyStatement:
        case SyntaxKind::RestrictPropertyStatement:
            return true;
        default:
            return false;
    }
}